

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O1

bool tinyusdz::ACEScg_to_linear_sRGB
               (vector<float,_std::allocator<float>_> *in_img,size_t width,size_t height,
               size_t channels,vector<float,_std::allocator<float>_> *out_img,string *err)

{
  ostringstream *poVar1;
  undefined4 uVar2;
  ostream *poVar3;
  long lVar4;
  pointer pfVar5;
  pointer pfVar6;
  size_type __new_size;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ostringstream ss_e;
  string local_200;
  size_t local_1e0;
  string local_1d8;
  unsigned_long local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1e0 = channels;
  if (width == 0) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    ::std::__cxx11::ostringstream::ostringstream(poVar1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
               ,0x54);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"ACEScg_to_linear_sRGB",0x15);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(poVar1,0x3a2);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar7 = "width is zero.";
    lVar4 = 0xe;
LAB_0046bbff:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),pcVar7,lVar4);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"\n",1);
    if (err == (string *)0x0) goto LAB_0046bc5b;
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_200._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p == &local_200.field_2) goto LAB_0046bc5b;
  }
  else {
    if (height == 0) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      ::std::__cxx11::ostringstream::ostringstream(poVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"ACEScg_to_linear_sRGB",0x15);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(poVar1,0x3a6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pcVar7 = "height is zero.";
      lVar4 = 0xf;
      goto LAB_0046bbff;
    }
    if (channels == 0) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      ::std::__cxx11::ostringstream::ostringstream(poVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"ACEScg_to_linear_sRGB",0x15);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(poVar1,0x3aa);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pcVar7 = "channels is zero.";
      lVar4 = 0x11;
      goto LAB_0046bbff;
    }
    if (channels - 5 < 0xfffffffffffffffe) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      ::std::__cxx11::ostringstream::ostringstream(poVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"ACEScg_to_linear_sRGB",0x15);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(poVar1,0x3ae);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d8,"channels must be 3 or 4, but got {}","");
      fmt::format<unsigned_long>(&local_200,&local_1d8,&local_1e0);
    }
    else {
      if (out_img == (vector<float,_std::allocator<float>_> *)0x0) {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        ::std::__cxx11::ostringstream::ostringstream(poVar1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                   ,0x54);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ACEScg_to_linear_sRGB",0x15);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<(poVar1,0x3b2);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        pcVar7 = "`out_img` is nullptr.";
        lVar4 = 0x15;
        goto LAB_0046bbff;
      }
      __new_size = (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2;
      if (__new_size == channels * height * width) {
        ::std::vector<float,_std::allocator<float>_>::resize(out_img,__new_size);
        pfVar5 = (in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar6 = (out_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_1e0 == 3) {
          pfVar6 = pfVar6 + 2;
          pfVar5 = pfVar5 + 2;
          sVar8 = 0;
          do {
            lVar4 = 0;
            sVar9 = width;
            do {
              fVar10 = *(float *)((long)pfVar5 + lVar4 + -8);
              fVar12 = *(float *)((long)pfVar5 + lVar4 + -4);
              fVar11 = *(float *)((long)pfVar5 + lVar4);
              fVar13 = fVar11 * -0.083258 + fVar12 * -0.621792 + fVar10 * 1.705052;
              fVar14 = fVar11 * -0.012033211 + fVar10 * -0.130257;
              fVar12 = fVar11 * 1.152972 + fVar12 * -0.128969 + fVar10 * -0.024004;
              fVar10 = 0.0;
              if (0.0 <= fVar13) {
                fVar10 = fVar13;
              }
              fVar11 = 0.0;
              if (0.0 <= fVar14) {
                fVar11 = fVar14;
              }
              fVar13 = 0.0;
              if (0.0 <= fVar12) {
                fVar13 = fVar12;
              }
              *(float *)((long)pfVar6 + lVar4 + -8) = fVar10;
              *(float *)((long)pfVar6 + lVar4 + -4) = fVar11;
              *(float *)((long)pfVar6 + lVar4) = fVar13;
              lVar4 = lVar4 + 0xc;
              sVar9 = sVar9 - 1;
            } while (sVar9 != 0);
            sVar8 = sVar8 + 1;
            pfVar6 = pfVar6 + width * 3;
            pfVar5 = pfVar5 + width * 3;
          } while (sVar8 != height);
          return true;
        }
        pfVar6 = pfVar6 + 3;
        pfVar5 = pfVar5 + 3;
        sVar8 = 0;
        do {
          lVar4 = 0;
          sVar9 = width;
          do {
            fVar10 = *(float *)((long)pfVar5 + lVar4 + -0xc);
            fVar12 = *(float *)((long)pfVar5 + lVar4 + -8);
            fVar11 = *(float *)((long)pfVar5 + lVar4 + -4);
            uVar2 = *(undefined4 *)((long)pfVar5 + lVar4);
            fVar13 = fVar11 * -0.083258 + fVar12 * -0.621792 + fVar10 * 1.705052;
            fVar14 = fVar11 * -0.012033211 + fVar10 * -0.130257;
            fVar12 = fVar11 * 1.152972 + fVar12 * -0.128969 + fVar10 * -0.024004;
            fVar10 = 0.0;
            if (0.0 <= fVar13) {
              fVar10 = fVar13;
            }
            fVar11 = 0.0;
            if (0.0 <= fVar14) {
              fVar11 = fVar14;
            }
            fVar13 = 0.0;
            if (0.0 <= fVar12) {
              fVar13 = fVar12;
            }
            *(float *)((long)pfVar6 + lVar4 + -0xc) = fVar10;
            *(float *)((long)pfVar6 + lVar4 + -8) = fVar11;
            *(float *)((long)pfVar6 + lVar4 + -4) = fVar13;
            *(undefined4 *)((long)pfVar6 + lVar4) = uVar2;
            lVar4 = lVar4 + 0x10;
            sVar9 = sVar9 - 1;
          } while (sVar9 != 0);
          sVar8 = sVar8 + 1;
          pfVar6 = pfVar6 + width * 4;
          pfVar5 = pfVar5 + width * 4;
        } while (sVar8 != height);
        return true;
      }
      poVar1 = (ostringstream *)(local_1b0 + 8);
      ::std::__cxx11::ostringstream::ostringstream(poVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"ACEScg_to_linear_sRGB",0x15);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(poVar1,0x3b7);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d8,"Input buffer size must be {}, but got {}","");
      local_1b0._0_8_ = height * width * local_1e0;
      local_1b8 = (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2;
      fmt::format<unsigned_long,unsigned_long>
                (&local_200,(fmt *)&local_1d8,(string *)local_1b0,&local_1b8,
                 (unsigned_long *)out_img);
    }
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_1b0 + 8),local_200._M_dataplus._M_p,
                        local_200._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (err == (string *)0x0) goto LAB_0046bc5b;
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_200._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p == &local_200.field_2) goto LAB_0046bc5b;
  }
  operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
LAB_0046bc5b:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool ACEScg_to_linear_sRGB(const std::vector<float> &in_img, size_t width,
                         size_t height, size_t channels,
                         std::vector<float> *out_img, std::string *err) {

  if (width == 0) {
    PUSH_ERROR_AND_RETURN("width is zero.");
  }

  if (height == 0) {
    PUSH_ERROR_AND_RETURN("height is zero.");
  }

  if (channels == 0) {
    PUSH_ERROR_AND_RETURN("channels is zero.");
  }

  if ((channels != 3) && (channels != 4)) {
    PUSH_ERROR_AND_RETURN(fmt::format("channels must be 3 or 4, but got {}", channels));
  }

  if (out_img == nullptr) {
    PUSH_ERROR_AND_RETURN("`out_img` is nullptr.");
  }


  if (in_img.size() != (width * height * channels)) {
    PUSH_ERROR_AND_RETURN(fmt::format("Input buffer size must be {}, but got {}", (width * height * channels), in_img.size()));
  }

  out_img->resize(in_img.size());

  // inv(ACEScg_to_lin_sRGB)
  // 
  // https://www.shadertoy.com/view/WltSRB

  if (channels == 3) {
    for (size_t y = 0; y < height; y++) {
      for (size_t x = 0; x < width; x++) {
        float r, g, b;
        r = in_img[3 * (y * width + x) + 0];
        g = in_img[3 * (y * width + x) + 1];
        b = in_img[3 * (y * width + x) + 2];

        float out_rgb[3];
        out_rgb[0] =  1.705052f * r -0.621792f * g   -0.083258f * b;
        out_rgb[1] = -0.130257f * r + 1.140805f *  -0.010548f * b;
        out_rgb[2] = -0.024004f * r -0.128969f *g + 1.152972f * b;

        // clamp negative
        out_rgb[0] = (out_rgb[0] < 0.0f) ? 0.0f : out_rgb[0];
        out_rgb[1] = (out_rgb[1] < 0.0f) ? 0.0f : out_rgb[1];
        out_rgb[2] = (out_rgb[2] < 0.0f) ? 0.0f : out_rgb[2];

        (*out_img)[3 * (y * width + x) + 0] = out_rgb[0];
        (*out_img)[3 * (y * width + x) + 1] = out_rgb[1];
        (*out_img)[3 * (y * width + x) + 2] = out_rgb[2];
      }
    }

  } else { // rgba
    for (size_t y = 0; y < height; y++) {
      for (size_t x = 0; x < width; x++) {
        float r, g, b, a;
        r = in_img[4 * (y * width + x) + 0];
        g = in_img[4 * (y * width + x) + 1];
        b = in_img[4 * (y * width + x) + 2];
        a = in_img[4 * (y * width + x) + 3];

        float out_rgb[3];
        out_rgb[0] =  1.705052f * r -0.621792f * g   -0.083258f * b;
        out_rgb[1] = -0.130257f * r + 1.140805f *  -0.010548f * b;
        out_rgb[2] = -0.024004f * r -0.128969f *g + 1.152972f * b;

        // clamp negative value
        out_rgb[0] = (out_rgb[0] < 0.0f) ? 0.0f : out_rgb[0];
        out_rgb[1] = (out_rgb[1] < 0.0f) ? 0.0f : out_rgb[1];
        out_rgb[2] = (out_rgb[2] < 0.0f) ? 0.0f : out_rgb[2];

        (*out_img)[4 * (y * width + x) + 0] = out_rgb[0];
        (*out_img)[4 * (y * width + x) + 1] = out_rgb[1];
        (*out_img)[4 * (y * width + x) + 2] = out_rgb[2];
        (*out_img)[4 * (y * width + x) + 3] = a;
      }
    }
  }

  return true;
}